

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall kratos::Const::set_value(Const *this,int64_t new_value)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  VarException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  string local_70;
  Const *local_50;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_48;
  allocator_type local_21;
  
  iVar1 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])();
  if ((this->super_Var).is_signed_ == true) {
    uVar3 = -1L << ((byte)iVar1 - 1 & 0x3f);
    if ((new_value < (long)uVar3) || ((long)~uVar3 < new_value)) {
LAB_00184985:
      this_00 = (VarException *)__cxa_allocate_exception(0x10);
      uVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])(this);
      local_48.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)uVar2;
      format_str.size_ = 0x23;
      format_str.data_ = (char *)0x29;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_48;
      local_48.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)new_value;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_70,(detail *)"Unable to set const to {0} with width {1}",format_str,args);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_50;
      local_50 = this;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_48,__l,&local_21);
      VarException::VarException(this_00,&local_70,&local_48);
      __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if ((ulong)new_value >> ((byte)iVar1 & 0x3f) != 0 && iVar1 != 0x40) goto LAB_00184985;
  this->value_ = new_value;
  return;
}

Assistant:

void Const::set_value(int64_t new_value) {
    if (Const::is_legal(new_value, width(), is_signed()) != Const::ConstantLegal::Legal) {
        throw VarException(
            ::format("Unable to set const to {0} with width {1}", new_value, width()), {this});
    }
    value_ = new_value;
}